

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_sendf(Curl_easy *data,char *fmt,...)

{
  dynbuf *s;
  connectdata *pcVar1;
  char in_AL;
  byte bVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  pcVar1 = data->conn;
  pcVar5 = (pcVar1->proto).imapc.resptag;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  iVar3 = curlx_sltosi(pcVar1->connection_id % 0x1a);
  bVar2 = (pcVar1->proto).imapc.cmdid + 1;
  (pcVar1->proto).imapc.cmdid = bVar2;
  curl_msnprintf(pcVar5,5,"%c%03d",(ulong)(iVar3 + 0x41),(ulong)bVar2);
  s = &(pcVar1->proto).imapc.dyn;
  Curl_dyn_reset(s);
  CVar4 = Curl_dyn_addf(s,"%s %s",pcVar5,fmt);
  if (CVar4 == CURLE_OK) {
    ap[0].reg_save_area = local_d8;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x10;
    ap[0].fp_offset = 0x30;
    pcVar5 = Curl_dyn_ptr(s);
    CVar4 = Curl_pp_vsendf(data,&(pcVar1->proto).ftpc.pp,pcVar5,ap);
  }
  return CVar4;
}

Assistant:

static CURLcode imap_sendf(struct Curl_easy *data, const char *fmt, ...)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &data->conn->proto.imapc;

  DEBUGASSERT(fmt);

  /* Calculate the tag based on the connection ID and command ID */
  msnprintf(imapc->resptag, sizeof(imapc->resptag), "%c%03d",
            'A' + curlx_sltosi((long)(data->conn->connection_id % 26)),
            ++imapc->cmdid);

  /* start with a blank buffer */
  Curl_dyn_reset(&imapc->dyn);

  /* append tag + space + fmt */
  result = Curl_dyn_addf(&imapc->dyn, "%s %s", imapc->resptag, fmt);
  if(!result) {
    va_list ap;
    va_start(ap, fmt);
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
    result = Curl_pp_vsendf(data, &imapc->pp, Curl_dyn_ptr(&imapc->dyn), ap);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
    va_end(ap);
  }
  return result;
}